

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_base_assert_ok_nolock_(event_base *base)

{
  event *peVar1;
  event *peVar2;
  common_timeout_list *pcVar3;
  event_callback *peVar4;
  bool bVar5;
  int iVar6;
  event_callback *local_88;
  event_callback *evcb_1;
  event_callback **nextp_1;
  event_callback *elm2_1;
  event_callback *elm1_1;
  event_callback *evcb;
  event **nextp;
  event *elm2;
  event *elm1;
  event *ev_1;
  event *last;
  common_timeout_list *ctl;
  event *p_ev;
  event *ev;
  int local_18;
  int parent;
  int count;
  int i;
  event_base *base_local;
  
  evmap_check_integrity_(base);
  for (parent = 1; parent < (int)(base->timeheap).n; parent = parent + 1) {
    peVar1 = (base->timeheap).p[parent];
    peVar2 = (base->timeheap).p[(parent + -1) / 2];
    if (((peVar1->ev_evcallback).evcb_flags & 1U) == 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0xf8d,"ev->ev_flags & EVLIST_TIMEOUT","event_base_assert_ok_nolock_");
    }
    if ((peVar2->ev_timeout).tv_sec == (peVar1->ev_timeout).tv_sec) {
      bVar5 = (peVar2->ev_timeout).tv_usec <= (peVar1->ev_timeout).tv_usec;
    }
    else {
      bVar5 = (peVar2->ev_timeout).tv_sec <= (peVar1->ev_timeout).tv_sec;
    }
    if (!bVar5) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0xf8e,"evutil_timercmp(&p_ev->ev_timeout, &ev->ev_timeout, <=)",
                 "event_base_assert_ok_nolock_");
    }
    if ((peVar1->ev_timeout_pos).min_heap_idx != parent) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0xf8f,"ev->ev_timeout_pos.min_heap_idx == i","event_base_assert_ok_nolock_");
    }
  }
  parent = 0;
  do {
    if (base->n_common_timeouts <= parent) {
      local_18 = 0;
      parent = 0;
      do {
        if (base->nactivequeues <= parent) {
          local_88 = (base->active_later_queue).tqh_first;
          while( true ) {
            if (local_88 == (event_callback *)0x0) {
              if (local_18 != base->event_count_active) {
                event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                           ,0xfb6,"count == base->event_count_active","event_base_assert_ok_nolock_"
                          );
              }
              return;
            }
            if ((local_88->evcb_flags & 0x28U) != 0x20) break;
            local_18 = local_18 + 1;
            local_88 = (local_88->evcb_active_next).tqe_next;
          }
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xfb2,
                     "(evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE_LATER"
                     ,"event_base_assert_ok_nolock_");
        }
        if (base->activequeues[parent].tqh_first != (event_callback *)0x0) {
          elm2_1 = base->activequeues[parent].tqh_first;
          nextp_1 = (event_callback **)(elm2_1->evcb_active_next).tqe_next;
          while (elm2_1 != (event_callback *)0x0 && nextp_1 != (event_callback **)0x0) {
            if (elm2_1 == (event_callback *)nextp_1) {
              event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                         ,0xfa7,"elm1 != elm2","event_base_assert_ok_nolock_");
            }
            elm2_1 = (elm2_1->evcb_active_next).tqe_next;
            peVar4 = *nextp_1;
            if (peVar4 == (event_callback *)0x0) break;
            if (elm2_1 == peVar4) {
              event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                         ,0xfa7,"elm1 != elm2","event_base_assert_ok_nolock_");
            }
            nextp_1 = (event_callback **)(peVar4->evcb_active_next).tqe_next;
          }
          evcb_1 = (event_callback *)(base->activequeues + parent);
          for (elm2_1 = base->activequeues[parent].tqh_first; elm2_1 != (event_callback *)0x0;
              elm2_1 = (elm2_1->evcb_active_next).tqe_next) {
            if ((evcb_1->evcb_active_next).tqe_next != elm2_1) {
              event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                         ,0xfa7,"*nextp == elm1","event_base_assert_ok_nolock_");
            }
            if (evcb_1 != (event_callback *)(elm2_1->evcb_active_next).tqe_prev) {
              event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                         ,0xfa7,"nextp == elm1->evcb_active_next.tqe_prev",
                         "event_base_assert_ok_nolock_");
            }
            evcb_1 = elm2_1;
          }
          if (evcb_1 != (event_callback *)base->activequeues[parent].tqh_last) {
            event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                       ,0xfa7,"nextp == (&base->activequeues[i])->tqh_last",
                       "event_base_assert_ok_nolock_");
          }
        }
        for (elm1_1 = base->activequeues[parent].tqh_first; elm1_1 != (event_callback *)0x0;
            elm1_1 = (elm1_1->evcb_active_next).tqe_next) {
          if ((elm1_1->evcb_flags & 0x28U) != 8) {
            event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                       ,0xfa9,
                       "(evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE",
                       "event_base_assert_ok_nolock_");
          }
          if ((uint)elm1_1->evcb_pri != parent) {
            event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                       ,0xfaa,"evcb->evcb_pri == i","event_base_assert_ok_nolock_");
          }
          local_18 = local_18 + 1;
        }
        parent = parent + 1;
      } while( true );
    }
    pcVar3 = base->common_timeout_queues[parent];
    ev_1 = (event *)0x0;
    if ((pcVar3->events).tqh_first != (event *)0x0) {
      elm2 = (pcVar3->events).tqh_first;
      nextp = (event **)(elm2->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
      while (elm2 != (event *)0x0 && nextp != (event **)0x0) {
        if (elm2 == (event *)nextp) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xf97,"elm1 != elm2","event_base_assert_ok_nolock_");
        }
        elm2 = (elm2->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
        peVar1 = nextp[5];
        if (peVar1 == (event *)0x0) break;
        if (elm2 == peVar1) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xf97,"elm1 != elm2","event_base_assert_ok_nolock_");
        }
        nextp = (event **)(peVar1->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
      }
      elm2 = (pcVar3->events).tqh_first;
      evcb = (event_callback *)pcVar3;
      while (elm2 != (event *)0x0) {
        if ((event *)(evcb->evcb_active_next).tqe_next != elm2) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xf97,"*nextp == elm1","event_base_assert_ok_nolock_");
        }
        if (evcb != (event_callback *)(elm2->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xf97,"nextp == elm1->ev_timeout_pos.ev_next_with_common_timeout.tqe_prev",
                     "event_base_assert_ok_nolock_");
        }
        evcb = (event_callback *)&elm2->ev_timeout_pos;
        elm2 = ((anon_struct_16_2_4dd83919_for_ev_next_with_common_timeout *)evcb)->tqe_next;
      }
      if (evcb != (event_callback *)(pcVar3->events).tqh_last) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xf97,"nextp == (&ctl->events)->tqh_last","event_base_assert_ok_nolock_");
      }
    }
    for (elm1 = (pcVar3->events).tqh_first; elm1 != (event *)0x0;
        elm1 = (elm1->ev_timeout_pos).ev_next_with_common_timeout.tqe_next) {
      if (ev_1 != (event *)0x0) {
        if ((ev_1->ev_timeout).tv_sec == (elm1->ev_timeout).tv_sec) {
          bVar5 = (ev_1->ev_timeout).tv_usec <= (elm1->ev_timeout).tv_usec;
        }
        else {
          bVar5 = (ev_1->ev_timeout).tv_sec <= (elm1->ev_timeout).tv_sec;
        }
        if (!bVar5) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xf9b,"evutil_timercmp(&last->ev_timeout, &ev->ev_timeout, <=)",
                     "event_base_assert_ok_nolock_");
        }
      }
      if (((elm1->ev_evcallback).evcb_flags & 1U) == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xf9c,"ev->ev_flags & EVLIST_TIMEOUT","event_base_assert_ok_nolock_");
      }
      iVar6 = is_common_timeout(&elm1->ev_timeout,base);
      if (iVar6 == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xf9d,"is_common_timeout(&ev->ev_timeout,base)","event_base_assert_ok_nolock_");
      }
      if ((long)((elm1->ev_timeout).tv_usec & 0xff00000U) >> 0x14 != (long)parent) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0xf9e,"COMMON_TIMEOUT_IDX(&ev->ev_timeout) == i","event_base_assert_ok_nolock_")
        ;
      }
      ev_1 = elm1;
    }
    parent = parent + 1;
  } while( true );
}

Assistant:

void
event_base_assert_ok_nolock_(struct event_base *base)
{
	int i;
	int count;

	/* First do checks on the per-fd and per-signal lists */
	evmap_check_integrity_(base);

	/* Check the heap property */
	for (i = 1; i < (int)base->timeheap.n; ++i) {
		int parent = (i - 1) / 2;
		struct event *ev, *p_ev;
		ev = base->timeheap.p[i];
		p_ev = base->timeheap.p[parent];
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
		EVUTIL_ASSERT(evutil_timercmp(&p_ev->ev_timeout, &ev->ev_timeout, <=));
		EVUTIL_ASSERT(ev->ev_timeout_pos.min_heap_idx == i);
	}

	/* Check that the common timeouts are fine */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl = base->common_timeout_queues[i];
		struct event *last=NULL, *ev;

		EVUTIL_ASSERT_TAILQ_OK(&ctl->events, event, ev_timeout_pos.ev_next_with_common_timeout);

		TAILQ_FOREACH(ev, &ctl->events, ev_timeout_pos.ev_next_with_common_timeout) {
			if (last)
				EVUTIL_ASSERT(evutil_timercmp(&last->ev_timeout, &ev->ev_timeout, <=));
			EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
			EVUTIL_ASSERT(is_common_timeout(&ev->ev_timeout,base));
			EVUTIL_ASSERT(COMMON_TIMEOUT_IDX(&ev->ev_timeout) == i);
			last = ev;
		}
	}

	/* Check the active queues. */
	count = 0;
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		EVUTIL_ASSERT_TAILQ_OK(&base->activequeues[i], event_callback, evcb_active_next);
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE);
			EVUTIL_ASSERT(evcb->evcb_pri == i);
			++count;
		}
	}

	{
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->active_later_queue, evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE_LATER);
			++count;
		}
	}
	EVUTIL_ASSERT(count == base->event_count_active);
}